

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ProfiledNewScArray
              (uint32 elementCount,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  byte bVar4;
  JavascriptNativeArray *this;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar4 = (arrayInfo->field_0).bits;
  if ((bVar4 & 1) == 0) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
    if (!bVar3) {
      this = &JavascriptLibrary::CreateNativeIntArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount)->
              super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b6c2dd;
    }
    bVar4 = (arrayInfo->field_0).bits;
  }
  if ((bVar4 & 2) == 0) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
    if (!bVar3) {
      this = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount)->
              super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b6c2dd;
    }
  }
  this = (JavascriptNativeArray *)
         JavascriptLibrary::CreateArrayLiteral
                   ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount);
LAB_00b6c2dd:
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewScArray(uint32 elementCount, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScArray, reentrancylock, scriptContext->GetThreadContext());
        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(elementCount);
        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScArray);
    }